

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm3.c
# Opt level: O1

void sm3(void *in,unsigned_long inlen,void *out)

{
  int iVar1;
  sm3_context ctx;
  uint8_t local_108;
  undefined1 local_107;
  undefined1 local_106;
  byte local_105;
  undefined1 local_104;
  undefined1 local_103;
  undefined1 local_102;
  char local_101;
  sm3_context local_100;
  
  local_100.total[0] = 0;
  local_100.total[1] = 0;
  local_100.state[0] = 0x7380166f;
  local_100.state[1] = 0x4914b2b9;
  local_100.state[2] = 0x172442d7;
  local_100.state[3] = 0xda8a0600;
  local_100.state[4] = 0xa96f30bc;
  local_100.state[5] = 0x163138aa;
  local_100.state[6] = 0xe38dee4d;
  local_100.state[7] = 0xb0fb0e4e;
  sm3_update(&local_100,(uint8_t *)in,inlen);
  iVar1 = local_100.total[1] << 3;
  local_105 = (byte)iVar1 | local_100.total[0]._3_1_ >> 5;
  local_101 = (char)local_100.total[0] * '\b';
  local_108 = (uint8_t)((uint)iVar1 >> 0x18);
  local_107 = (undefined1)((uint)iVar1 >> 0x10);
  local_106 = (undefined1)((uint)iVar1 >> 8);
  local_104 = (undefined1)(local_100.total[0] >> 0x15);
  local_103 = (undefined1)(local_100.total[0] >> 0xd);
  local_102 = (undefined1)(local_100.total[0] >> 5);
  sm3_update(&local_100,sm3_padding,
             (ulong)(((uint)(0x37 < (local_100.total[0] & 0x3f)) << 6 | 0x38) -
                    (local_100.total[0] & 0x3f)));
  sm3_update(&local_100,&local_108,8);
  *(uint32_t *)out =
       local_100.state[0] >> 0x18 | (local_100.state[0] & 0xff0000) >> 8 |
       (local_100.state[0] & 0xff00) << 8 | local_100.state[0] << 0x18;
  *(uint32_t *)((long)out + 4) =
       local_100.state[1] >> 0x18 | (local_100.state[1] & 0xff0000) >> 8 |
       (local_100.state[1] & 0xff00) << 8 | local_100.state[1] << 0x18;
  *(uint32_t *)((long)out + 8) =
       local_100.state[2] >> 0x18 | (local_100.state[2] & 0xff0000) >> 8 |
       (local_100.state[2] & 0xff00) << 8 | local_100.state[2] << 0x18;
  *(uint32_t *)((long)out + 0xc) =
       local_100.state[3] >> 0x18 | (local_100.state[3] & 0xff0000) >> 8 |
       (local_100.state[3] & 0xff00) << 8 | local_100.state[3] << 0x18;
  *(uint32_t *)((long)out + 0x10) =
       local_100.state[4] >> 0x18 | (local_100.state[4] & 0xff0000) >> 8 |
       (local_100.state[4] & 0xff00) << 8 | local_100.state[4] << 0x18;
  *(uint32_t *)((long)out + 0x14) =
       local_100.state[5] >> 0x18 | (local_100.state[5] & 0xff0000) >> 8 |
       (local_100.state[5] & 0xff00) << 8 | local_100.state[5] << 0x18;
  *(uint32_t *)((long)out + 0x18) =
       local_100.state[6] >> 0x18 | (local_100.state[6] & 0xff0000) >> 8 |
       (local_100.state[6] & 0xff00) << 8 | local_100.state[6] << 0x18;
  *(uint32_t *)((long)out + 0x1c) =
       local_100.state[7] >> 0x18 | (local_100.state[7] & 0xff0000) >> 8 |
       (local_100.state[7] & 0xff00) << 8 | local_100.state[7] << 0x18;
  return;
}

Assistant:

void sm3(const void *in, unsigned long inlen, void* out)
{
	struct sm3_context ctx;
	sm3_init(&ctx);
	sm3_update(&ctx, (const uint8_t *)in, (size_t)inlen);
	sm3_final(&ctx, (uint8_t*)out);
}